

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O3

int inproc_ep_set_recvmaxsz(void *arg,void *v,size_t sz,nni_opt_type t)

{
  int iVar1;
  size_t in_RAX;
  size_t local_28;
  size_t val;
  
  local_28 = in_RAX;
  iVar1 = nni_copyin_size(&local_28,v,sz,0,0xffffffff,t);
  if (iVar1 == 0) {
    nni_mtx_lock((nni_mtx *)((long)arg + 0xa0));
    *(size_t *)((long)arg + 0x98) = local_28;
    nni_mtx_unlock((nni_mtx *)((long)arg + 0xa0));
  }
  return iVar1;
}

Assistant:

static int
inproc_ep_set_recvmaxsz(void *arg, const void *v, size_t sz, nni_opt_type t)
{
	inproc_ep *ep = arg;
	size_t     val;
	int        rv;
	if ((rv = nni_copyin_size(&val, v, sz, 0, NNI_MAXSZ, t)) == 0) {
		nni_mtx_lock(&ep->mtx);
		ep->rcvmax = val;
		nni_mtx_unlock(&ep->mtx);
	}
	return (rv);
}